

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O3

RayDifferential * __thiscall
pbrt::Transform::operator()
          (RayDifferential *__return_storage_ptr__,Transform *this,RayDifferential *r,Float *tMax)

{
  Float FVar1;
  float fVar2;
  float fVar3;
  Float FVar4;
  Float FVar5;
  float fVar6;
  Float FVar7;
  Float FVar8;
  Float FVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined4 uVar16;
  uintptr_t uVar15;
  float fVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  Point3fi local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  Interval<float> local_38;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  uVar14 = (r->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
  uVar16 = (r->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar18 = (r->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
  uVar19 = (r->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
  uVar13 = *(undefined8 *)&(r->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
  auVar28._4_4_ = uVar18;
  auVar28._0_4_ = uVar18;
  auVar28._8_4_ = uVar18;
  auVar28._12_4_ = uVar18;
  auVar23._4_4_ = uVar19;
  auVar23._0_4_ = uVar19;
  auVar23._8_4_ = uVar19;
  auVar23._12_4_ = uVar19;
  FVar1 = (r->super_Ray).time;
  uVar15 = (r->super_Ray).medium.
           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           .bits;
  local_48 = vmovlhps_avx(auVar28,auVar23);
  uStack_d0 = (undefined4)uVar13;
  auVar22._4_4_ = uStack_d0;
  auVar22._0_4_ = uStack_d0;
  auVar22._8_4_ = uStack_d0;
  auVar22._12_4_ = uStack_d0;
  local_98._0_4_ = uVar14;
  local_38 = (Interval<float>)vmovlps_avx(auVar22);
  uStack_cc = (undefined4)((ulong)uVar13 >> 0x20);
  local_78._0_4_ = uStack_cc;
  local_88._0_4_ = uVar16;
  operator()(&local_b8,this,(Point3fi *)local_48);
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)((float)local_98._0_4_ * (this->m).m[1][1])),
                            ZEXT416((uint)local_78._0_4_),ZEXT416((uint)(this->m).m[1][0]));
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)((float)local_98._0_4_ * (this->m).m[0][1])),
                            ZEXT416((uint)local_78._0_4_),ZEXT416((uint)(this->m).m[0][0]));
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)((float)local_98._0_4_ * (this->m).m[2][1])),
                            ZEXT416((uint)local_78._0_4_),ZEXT416((uint)(this->m).m[2][0]));
  local_98 = vfmadd231ss_fma(auVar28,ZEXT416((uint)local_88._0_4_),ZEXT416((uint)(this->m).m[1][2]))
  ;
  auVar28 = vfmadd231ss_fma(auVar23,ZEXT416((uint)local_88._0_4_),ZEXT416((uint)(this->m).m[0][2]));
  local_78 = vfmadd231ss_fma(auVar22,ZEXT416((uint)local_88._0_4_),ZEXT416((uint)(this->m).m[2][2]))
  ;
  auVar24._0_12_ = ZEXT812(0);
  auVar24._12_4_ = 0;
  fVar37 = local_98._0_4_;
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar37 * fVar37)),auVar28,auVar28);
  auVar23 = vfmadd231ss_fma(auVar23,local_78,local_78);
  fVar34 = auVar23._0_4_;
  bVar20 = NAN(fVar34);
  bVar21 = fVar34 == 0.0;
  local_88 = auVar28;
  if (fVar34 <= 0.0) {
    auVar25._8_8_ = 0;
    auVar25._0_4_ =
         local_b8.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
    auVar25._4_4_ =
         local_b8.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
  }
  else {
    auVar35._8_4_ = 0x7fffffff;
    auVar35._0_8_ = 0x7fffffff7fffffff;
    auVar35._12_4_ = 0x7fffffff;
    auVar23 = vandps_avx(local_98,auVar35);
    auVar22 = vandps_avx(auVar28,auVar35);
    auVar25 = vandps_avx(local_78,auVar35);
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ * 0.0)),auVar24,auVar22);
    auVar23 = vfmadd231ss_fma(auVar23,auVar24,auVar25);
    fVar34 = auVar23._0_4_ / fVar34;
    fVar17 = auVar28._0_4_ * fVar34;
    i.high = fVar17;
    i.low = fVar17;
    local_68 = ZEXT416((uint)(fVar37 * fVar34));
    local_58 = ZEXT416((uint)(local_78._0_4_ * fVar34));
    auVar31._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_b8,i);
    auVar31._8_56_ = extraout_var;
    uVar13 = vmovlps_avx(auVar31._0_16_);
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.low = (float)uVar13;
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.high = (float)((ulong)uVar13 >> 0x20);
    i_00.high = (float)local_68._0_4_;
    i_00.low = (float)local_68._0_4_;
    auVar32._0_8_ =
         Interval<float>::operator+<float>
                   (&local_b8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
    auVar32._8_56_ = extraout_var_00;
    uVar13 = vmovlps_avx(auVar32._0_16_);
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.low = (float)uVar13;
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.high = (float)((ulong)uVar13 >> 0x20);
    i_01.high = (float)local_58._0_4_;
    i_01.low = (float)local_58._0_4_;
    auVar33._0_8_ =
         Interval<float>::operator+<float>
                   (&local_b8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
    auVar33._8_56_ = extraout_var_01;
    auVar25 = auVar33._0_16_;
    bVar21 = tMax == (Float *)0x0;
    bVar20 = (POPCOUNT((ulong)tMax & 0xff) & 1U) == 0;
    if (!bVar21) {
      *tMax = *tMax - fVar34;
    }
  }
  auVar39._4_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar39._0_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar39._8_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar39._12_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  auVar28 = vhaddps_avx(auVar25,auVar25);
  auVar23 = vinsertps_avx(local_88,local_98,0x10);
  auVar22 = vinsertps_avx(auVar39,ZEXT416((uint)local_b8.super_Point3<pbrt::Interval<float>_>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
                                                .high),0x10);
  auVar36._0_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar22._0_4_;
  auVar36._4_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar22._4_4_;
  auVar36._8_4_ = auVar22._8_4_ + 0.0;
  auVar36._12_4_ = auVar22._12_4_ + 0.0;
  auVar38._8_4_ = 0x3f000000;
  auVar38._0_8_ = 0x3f0000003f000000;
  auVar38._12_4_ = 0x3f000000;
  auVar22 = vmulps_avx512vl(auVar36,auVar38);
  uVar13 = vmovlps_avx(auVar22);
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar13;
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar13 >> 0x20);
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z = auVar28._0_4_ * 0.5;
  uVar13 = vmovlps_avx(auVar23);
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar13;
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar13 >> 0x20);
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z = local_78._0_4_;
  (__return_storage_ptr__->super_Ray).time = FVar1;
  (__return_storage_ptr__->super_Ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar15;
  __return_storage_ptr__->hasDifferentials = r->hasDifferentials;
  fVar34 = (r->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y;
  fVar37 = (this->m).m[0][1];
  fVar17 = (this->m).m[1][1];
  fVar2 = (this->m).m[2][1];
  fVar3 = (r->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x;
  FVar1 = (this->m).m[0][0];
  FVar4 = (this->m).m[1][0];
  FVar5 = (this->m).m[2][0];
  fVar6 = (r->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z;
  FVar7 = (this->m).m[0][2];
  FVar8 = (this->m).m[1][2];
  FVar9 = (this->m).m[2][2];
  fVar10 = (this->m).m[0][3];
  fVar11 = (this->m).m[1][3];
  auVar23 = vmulss_avx512f(ZEXT416((uint)fVar34),ZEXT416((uint)fVar2));
  auVar29 = ZEXT416((uint)(this->m).m[3][1]);
  auVar22 = vmulss_avx512f(ZEXT416((uint)fVar34),auVar29);
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar37)),ZEXT416((uint)FVar1),
                            ZEXT416((uint)fVar3));
  auVar24 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar34 * fVar17)),ZEXT416((uint)FVar4),
                                ZEXT416((uint)fVar3));
  auVar23 = vfmadd231ss_avx512f(auVar23,ZEXT416((uint)FVar5),ZEXT416((uint)fVar3));
  auVar39 = ZEXT416((uint)(this->m).m[3][0]);
  auVar22 = vfmadd231ss_avx512f(auVar22,auVar39,ZEXT416((uint)fVar3));
  auVar25 = vfmadd231ss_avx512f(auVar23,ZEXT416((uint)FVar9),ZEXT416((uint)fVar6));
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)FVar7),ZEXT416((uint)fVar6));
  auVar23 = vfmadd231ss_fma(auVar24,ZEXT416((uint)FVar8),ZEXT416((uint)fVar6));
  auVar35 = ZEXT416((uint)(this->m).m[3][2]);
  auVar22 = vfmadd231ss_fma(auVar22,auVar35,ZEXT416((uint)fVar6));
  fVar34 = (this->m).m[3][3];
  fVar3 = fVar10 + auVar28._0_4_;
  fVar6 = fVar11 + auVar23._0_4_;
  auVar38 = ZEXT416((uint)(this->m).m[2][3]);
  auVar23 = vaddss_avx512f(auVar38,auVar25);
  auVar28 = ZEXT416((uint)(fVar34 + auVar22._0_4_));
  auVar22 = vdivss_avx512f(ZEXT416((uint)fVar3),auVar28);
  auVar24 = vdivss_avx512f(ZEXT416((uint)fVar6),auVar28);
  auVar28 = vucomiss_avx512f(ZEXT416(0x3f800000));
  auVar25 = vdivss_avx512f(auVar23,auVar28);
  bVar21 = (bool)(bVar21 & !bVar20);
  auVar26._4_12_ = auVar22._4_12_;
  auVar26._0_4_ = (uint)bVar21 * (int)fVar3 + (uint)!bVar21 * auVar22._0_4_;
  auVar27._4_12_ = auVar24._4_12_;
  auVar27._0_4_ = (uint)bVar21 * (int)fVar6 + (uint)!bVar21 * auVar24._0_4_;
  auVar28 = vinsertps_avx512f(auVar26,auVar27,0x10);
  uVar13 = vmovlps_avx(auVar28);
  (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar13;
  (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar13 >> 0x20);
  (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z =
       (float)((uint)bVar21 * auVar23._0_4_ + (uint)!bVar21 * auVar25._0_4_);
  fVar3 = (r->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y;
  fVar6 = (r->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x;
  fVar12 = (r->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z;
  auVar28 = vmulss_avx512f(ZEXT416((uint)fVar37),ZEXT416((uint)fVar3));
  auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)FVar1),ZEXT416((uint)fVar6));
  auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)FVar7),ZEXT416((uint)fVar12));
  auVar23 = vaddss_avx512f(ZEXT416((uint)fVar10),auVar28);
  auVar28 = vmulss_avx512f(ZEXT416((uint)fVar17),ZEXT416((uint)fVar3));
  auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)FVar4),ZEXT416((uint)fVar6));
  auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)FVar8),ZEXT416((uint)fVar12));
  auVar22 = vaddss_avx512f(ZEXT416((uint)fVar11),auVar28);
  auVar28 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar3));
  auVar24 = vmulss_avx512f(auVar29,ZEXT416((uint)fVar3));
  auVar24 = vfmadd231ss_avx512f(auVar24,auVar39,ZEXT416((uint)fVar6));
  auVar25 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)FVar5),ZEXT416((uint)fVar6));
  auVar28 = vfmadd231ss_fma(auVar24,auVar35,ZEXT416((uint)fVar12));
  auVar24 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)FVar9),ZEXT416((uint)fVar12));
  fVar34 = fVar34 + auVar28._0_4_;
  auVar24 = vaddss_avx512f(auVar38,auVar24);
  auVar28 = vucomiss_avx512f(ZEXT416(0x3f800000));
  auVar25 = vdivss_avx512f(auVar24,auVar28);
  bVar20 = !bVar21 && bVar21 != false;
  auVar29._0_4_ =
       (uint)bVar20 * (int)auVar23._0_4_ + (uint)(bVar21 < 2) * (int)(auVar23._0_4_ / fVar34);
  auVar29._4_12_ = auVar23._4_12_;
  auVar30._0_4_ =
       (uint)bVar20 * (int)auVar22._0_4_ + (uint)(bVar21 < 2) * (int)(auVar22._0_4_ / fVar34);
  auVar30._4_12_ = auVar22._4_12_;
  auVar28 = vinsertps_avx(auVar29,auVar30,0x10);
  uVar13 = vmovlps_avx(auVar28);
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar13;
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar13 >> 0x20);
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
       (float)((uint)bVar20 * auVar24._0_4_ + (uint)(bVar21 < 2) * auVar25._0_4_);
  fVar34 = (r->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar3 = (r->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar6 = (r->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar37)),ZEXT416((uint)FVar1),
                            ZEXT416((uint)fVar3));
  auVar23 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar34 * fVar17)),ZEXT416((uint)FVar4),
                                ZEXT416((uint)fVar3));
  auVar22 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar34 * fVar2)),ZEXT416((uint)FVar5),
                                ZEXT416((uint)fVar3));
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)FVar7),ZEXT416((uint)fVar6));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)FVar8),ZEXT416((uint)fVar6));
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)FVar9),ZEXT416((uint)fVar6));
  auVar28 = vinsertps_avx(auVar28,auVar23,0x10);
  uVar13 = vmovlps_avx(auVar28);
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar13;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar13 >> 0x20);
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z = auVar22._0_4_;
  fVar34 = (r->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar3 = (r->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar6 = (r->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar37)),ZEXT416((uint)fVar3),
                            ZEXT416((uint)FVar1));
  auVar23 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar34 * fVar17)),ZEXT416((uint)fVar3),
                                ZEXT416((uint)FVar4));
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar6),ZEXT416((uint)FVar7));
  auVar22 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar34 * fVar2)),ZEXT416((uint)FVar5),
                                ZEXT416((uint)fVar3));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar6),ZEXT416((uint)FVar8));
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)FVar9),ZEXT416((uint)fVar6));
  auVar28 = vinsertps_avx(auVar28,auVar23,0x10);
  uVar13 = vmovlps_avx(auVar28);
  (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar13;
  (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar13 >> 0x20);
  (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z = auVar22._0_4_;
  return __return_storage_ptr__;
}

Assistant:

inline RayDifferential Transform::operator()(const RayDifferential &r,
                                             Float *tMax) const {
    Ray tr = (*this)(Ray(r), tMax);
    RayDifferential ret(tr.o, tr.d, tr.time, tr.medium);
    ret.hasDifferentials = r.hasDifferentials;
    ret.rxOrigin = (*this)(r.rxOrigin);
    ret.ryOrigin = (*this)(r.ryOrigin);
    ret.rxDirection = (*this)(r.rxDirection);
    ret.ryDirection = (*this)(r.ryDirection);
    return ret;
}